

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

_Bool ts_subtree_has_trailing_empty_descendant(Subtree self,Subtree other)

{
  uint uVar1;
  uint uVar2;
  Subtree self_00;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  
  if (((ulong)self.ptr & 1) == 0) {
    uVar4 = (ulong)(self.ptr)->child_count;
  }
  else {
    uVar4 = 0;
  }
  do {
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) {
      cVar3 = '\x02';
      break;
    }
    self_00 = (Subtree)((self.ptr)->field_17).field_0.children[uVar4].ptr;
    if (((ulong)self_00.ptr & 1) == 0) {
      uVar1 = ((Length *)((long)self_00 + 4))->bytes;
    }
    else {
      uVar1 = self_00._2_4_ & 0xff;
    }
    if (((ulong)self_00.ptr & 1) == 0) {
      uVar2 = ((Length *)((long)self_00 + 0x10))->bytes;
    }
    else {
      uVar2 = self_00._3_4_ & 0xff;
    }
    if (uVar1 + uVar2 == 0) {
      if (self_00.ptr == other.ptr) {
        cVar3 = '\x01';
        goto LAB_001365f5;
      }
      cVar3 = ts_subtree_has_trailing_empty_descendant(self_00,other);
      bVar5 = !(bool)cVar3;
    }
    else {
      cVar3 = '\x02';
LAB_001365f5:
      bVar5 = false;
    }
  } while (bVar5);
  return cVar3 != '\x02';
}

Assistant:

static bool ts_subtree_has_trailing_empty_descendant(Subtree self, Subtree other) {
  for (unsigned i = ts_subtree_child_count(self) - 1; i + 1 > 0; i--) {
    Subtree child = self.ptr->children[i];
    if (ts_subtree_total_bytes(child) > 0) break;
    if (child.ptr == other.ptr || ts_subtree_has_trailing_empty_descendant(child, other)) {
      return true;
    }
  }
  return false;
}